

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_global.c
# Opt level: O2

TA_RetCode TA_RestoreCandleDefaultSettings(TA_CandleSettingType settingType)

{
  undefined8 *puVar1;
  TA_CandleSetting *pTVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  TA_LibcPriv *pTVar6;
  TA_RetCode TVar7;
  long lVar8;
  
  pTVar6 = TA_Globals;
  if (settingType < (TA_Near|TA_ShadowLong)) {
    if (settingType != TA_AllCandleSettings) {
      uVar3 = (ulong)settingType;
      TA_Globals->candleSettings[uVar3].factor = (double)(&DAT_001af0c0)[uVar3 * 3];
      uVar4 = *(undefined8 *)(&DAT_001af0b0 + uVar3 * 0x18);
      uVar5 = *(undefined8 *)(&UNK_001af0b8 + uVar3 * 0x18);
      pTVar2 = pTVar6->candleSettings + uVar3;
      pTVar2->settingType = (int)uVar4;
      pTVar2->rangeType = (int)((ulong)uVar4 >> 0x20);
      *(undefined8 *)&pTVar2->avgPeriod = uVar5;
      return TA_SUCCESS;
    }
    TVar7 = TA_SUCCESS;
    for (lVar8 = 0; lVar8 != 0x108; lVar8 = lVar8 + 0x18) {
      *(undefined8 *)((long)&pTVar6->candleSettings[0].factor + lVar8) =
           *(undefined8 *)((long)&DAT_001af0c0 + lVar8);
      uVar4 = *(undefined8 *)(&UNK_001af0b8 + lVar8);
      puVar1 = (undefined8 *)((long)&pTVar6->candleSettings[0].settingType + lVar8);
      *puVar1 = *(undefined8 *)(&DAT_001af0b0 + lVar8);
      puVar1[1] = uVar4;
    }
  }
  else {
    TVar7 = TA_BAD_PARAM;
  }
  return TVar7;
}

Assistant:

TA_RetCode TA_RestoreCandleDefaultSettings( TA_CandleSettingType settingType )
{
    const TA_CandleSetting TA_CandleDefaultSettings[] = {
        /* real body is long when it's longer than the average of the 10 previous candles' real body */
        { TA_BodyLong, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is very long when it's longer than 3 times the average of the 10 previous candles' real body */
        { TA_BodyVeryLong, TA_RangeType_RealBody, 10, 3.0 },
        /* real body is short when it's shorter than the average of the 10 previous candles' real bodies */
        { TA_BodyShort, TA_RangeType_RealBody, 10, 1.0 },
        /* real body is like doji's body when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_BodyDoji, TA_RangeType_HighLow, 10, 0.1 },
        /* shadow is long when it's longer than the real body */
        { TA_ShadowLong, TA_RangeType_RealBody, 0, 1.0 },
        /* shadow is very long when it's longer than 2 times the real body */
        { TA_ShadowVeryLong, TA_RangeType_RealBody, 0, 2.0 },
        /* shadow is short when it's shorter than half the average of the 10 previous candles' sum of shadows */
        { TA_ShadowShort, TA_RangeType_Shadows, 10, 1.0 },
        /* shadow is very short when it's shorter than 10% the average of the 10 previous candles' high-low range */
        { TA_ShadowVeryShort, TA_RangeType_HighLow, 10, 0.1 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "near" means "<= 20% of the average of the 5 previous candles' high-low range" */
        { TA_Near, TA_RangeType_HighLow, 5, 0.2 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "far" means ">= 60% of the average of the 5 previous candles' high-low range" */
        { TA_Far, TA_RangeType_HighLow, 5, 0.6 },
        /* when measuring distance between parts of candles or width of gaps */
        /* "equal" means "<= 5% of the average of the 5 previous candles' high-low range" */
        { TA_Equal, TA_RangeType_HighLow, 5, 0.05 }
    };

    int i;
    if( settingType > TA_AllCandleSettings )
        return TA_BAD_PARAM;
    if( settingType == TA_AllCandleSettings )
        for( i = 0; i < TA_AllCandleSettings; ++i )
            TA_Globals->candleSettings[i] = TA_CandleDefaultSettings[i];
    else
        TA_Globals->candleSettings[settingType] = TA_CandleDefaultSettings[settingType];
    return TA_SUCCESS;
}